

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O3

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)2>::flush_output
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)2> *this,int outputs)

{
  HalfCycles duration;
  long lVar1;
  long lVar2;
  
  if (((outputs & 1U) != 0) && ((this->video_).is_flushed_ == false)) {
    (this->video_).is_flushed_ = true;
    (this->video_).did_flush_ = true;
    duration.super_WrappedInt<HalfCycles>.length_ =
         (WrappedInt<HalfCycles>)
         (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
    (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
    ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)1>::run_for
              (&(this->video_).object_,duration);
  }
  if ((outputs & 2U) != 0) {
    lVar1 = (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_;
    lVar2 = lVar1 + 3;
    if (-1 < lVar1) {
      lVar2 = lVar1;
    }
    (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = lVar1 % 4;
    Outputs::Speaker::
    PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>::
    run_for(&this->speaker_,&this->audio_queue_,(Cycles)(lVar2 >> 2));
    if ((this->audio_queue_).actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        (this->audio_queue_).actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      std::condition_variable::notify_all();
      return;
    }
  }
  return;
}

Assistant:

void flush_output(int outputs) override {
			if(outputs & Output::Video) {
				video_.flush();
			}

			if(outputs & Output::Audio) {
				update_audio();
				audio_queue_.perform();
			}

			if constexpr (model == Model::Plus3) {
				fdc_.flush();
			}
		}